

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeDropTable(Btree *p,Pgno iTable,int *piMoved)

{
  Pgno PVar1;
  bool bVar2;
  MemPage *local_50;
  MemPage *pMove;
  BtShared *pBStack_40;
  Pgno maxRootPgno;
  BtShared *pBt;
  MemPage *pPage;
  Pgno *pPStack_28;
  int rc;
  int *piMoved_local;
  Btree *pBStack_18;
  Pgno iTable_local;
  Btree *p_local;
  
  pBt = (BtShared *)0x0;
  pBStack_40 = p->pBt;
  pPStack_28 = (Pgno *)piMoved;
  piMoved_local._4_4_ = iTable;
  pBStack_18 = p;
  PVar1 = btreePagecount(pBStack_40);
  if (PVar1 < iTable) {
    p_local._4_4_ = sqlite3CorruptError(0x11b05);
  }
  else {
    pPage._4_4_ = btreeGetPage(pBStack_40,piMoved_local._4_4_,(MemPage **)&pBt,0);
    p_local._4_4_ = pPage._4_4_;
    if (pPage._4_4_ == 0) {
      pPage._4_4_ = sqlite3BtreeClearTable(pBStack_18,piMoved_local._4_4_,(int *)0x0);
      if (pPage._4_4_ == 0) {
        *pPStack_28 = 0;
        if (pBStack_40->autoVacuum == '\0') {
          freePage((MemPage *)pBt,(int *)((long)&pPage + 4));
          releasePage((MemPage *)pBt);
        }
        else {
          sqlite3BtreeGetMeta(pBStack_18,4,(u32 *)((long)&pMove + 4));
          if (piMoved_local._4_4_ == pMove._4_4_) {
            freePage((MemPage *)pBt,(int *)((long)&pPage + 4));
            releasePage((MemPage *)pBt);
            if (pPage._4_4_ != 0) {
              return pPage._4_4_;
            }
          }
          else {
            releasePage((MemPage *)pBt);
            pPage._4_4_ = btreeGetPage(pBStack_40,pMove._4_4_,&local_50,0);
            if (pPage._4_4_ != 0) {
              return pPage._4_4_;
            }
            pPage._4_4_ = relocatePage(pBStack_40,local_50,'\x01',0,piMoved_local._4_4_,0);
            releasePage(local_50);
            if (pPage._4_4_ != 0) {
              return pPage._4_4_;
            }
            local_50 = (MemPage *)0x0;
            pPage._4_4_ = btreeGetPage(pBStack_40,pMove._4_4_,&local_50,0);
            freePage(local_50,(int *)((long)&pPage + 4));
            releasePage(local_50);
            if (pPage._4_4_ != 0) {
              return pPage._4_4_;
            }
            *pPStack_28 = pMove._4_4_;
          }
          do {
            pMove._4_4_ = pMove._4_4_ - 1;
            bVar2 = true;
            if (pMove._4_4_ != (uint)sqlite3PendingByte / pBStack_40->pageSize + 1) {
              PVar1 = ptrmapPageno(pBStack_40,pMove._4_4_);
              bVar2 = PVar1 == pMove._4_4_;
            }
          } while (bVar2);
          pPage._4_4_ = sqlite3BtreeUpdateMeta(pBStack_18,4,pMove._4_4_);
        }
        p_local._4_4_ = pPage._4_4_;
      }
      else {
        releasePage((MemPage *)pBt);
        p_local._4_4_ = pPage._4_4_;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static int btreeDropTable(Btree *p, Pgno iTable, int *piMoved){
  int rc;
  MemPage *pPage = 0;
  BtShared *pBt = p->pBt;

  assert( sqlite3BtreeHoldsMutex(p) );
  assert( p->inTrans==TRANS_WRITE );
  assert( iTable>=2 );
  if( iTable>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }

  rc = btreeGetPage(pBt, (Pgno)iTable, &pPage, 0);
  if( rc ) return rc;
  rc = sqlite3BtreeClearTable(p, iTable, 0);
  if( rc ){
    releasePage(pPage);
    return rc;
  }

  *piMoved = 0;

#ifdef SQLITE_OMIT_AUTOVACUUM
  freePage(pPage, &rc);
  releasePage(pPage);
#else
  if( pBt->autoVacuum ){
    Pgno maxRootPgno;
    sqlite3BtreeGetMeta(p, BTREE_LARGEST_ROOT_PAGE, &maxRootPgno);

    if( iTable==maxRootPgno ){
      /* If the table being dropped is the table with the largest root-page
      ** number in the database, put the root page on the free list. 
      */
      freePage(pPage, &rc);
      releasePage(pPage);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }else{
      /* The table being dropped does not have the largest root-page
      ** number in the database. So move the page that does into the 
      ** gap left by the deleted root-page.
      */
      MemPage *pMove;
      releasePage(pPage);
      rc = btreeGetPage(pBt, maxRootPgno, &pMove, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      rc = relocatePage(pBt, pMove, PTRMAP_ROOTPAGE, 0, iTable, 0);
      releasePage(pMove);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      pMove = 0;
      rc = btreeGetPage(pBt, maxRootPgno, &pMove, 0);
      freePage(pMove, &rc);
      releasePage(pMove);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      *piMoved = maxRootPgno;
    }

    /* Set the new 'max-root-page' value in the database header. This
    ** is the old value less one, less one more if that happens to
    ** be a root-page number, less one again if that is the
    ** PENDING_BYTE_PAGE.
    */
    maxRootPgno--;
    while( maxRootPgno==PENDING_BYTE_PAGE(pBt)
           || PTRMAP_ISPAGE(pBt, maxRootPgno) ){
      maxRootPgno--;
    }
    assert( maxRootPgno!=PENDING_BYTE_PAGE(pBt) );

    rc = sqlite3BtreeUpdateMeta(p, 4, maxRootPgno);
  }else{
    freePage(pPage, &rc);
    releasePage(pPage);
  }
#endif
  return rc;  
}